

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcRepresentation::~IfcRepresentation(IfcRepresentation *this)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  void *pvVar3;
  
  p_Var2 = (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>).
           _vptr_ObjectHelper[-3];
  p_Var1 = (_func_int *)
           ((long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>).
                   _vptr_ObjectHelper + (long)p_Var2);
  *(undefined ***)
   ((long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>).
           _vptr_ObjectHelper + (long)p_Var2) = &PTR__IfcRepresentation_007ea4b8;
  *(undefined ***)(&this->field_0x80 + (long)p_Var2) = &PTR__IfcRepresentation_007ea4e0;
  pvVar3 = *(void **)(p_Var2 + (long)&(this->Items).
                                      super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                                      .
                                      super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                     );
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)(p_Var1 + 0x78) - (long)pvVar3);
  }
  if (*(code **)(p_Var1 + 0x40) != p_Var1 + 0x50) {
    operator_delete(*(code **)(p_Var1 + 0x40),*(long *)(p_Var1 + 0x50) + 1);
  }
  if (*(code **)(p_Var1 + 0x18) != p_Var1 + 0x28) {
    operator_delete(*(code **)(p_Var1 + 0x18),*(long *)(p_Var1 + 0x28) + 1);
  }
  operator_delete(p_Var1,0x98);
  return;
}

Assistant:

IfcRepresentation() : Object("IfcRepresentation") {}